

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O2

void NJDNode_add_string(NJDNode *node,char *str)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  
  if (str != (char *)0x0) {
    __s = node->string;
    if (__s == (char *)0x0) {
      __dest = strdup(str);
    }
    else {
      sVar1 = strlen(__s);
      sVar2 = strlen(str);
      __dest = (char *)calloc(sVar1 + sVar2 + 1,1);
      strcpy(__dest,__s);
      strcat(__dest,str);
      free(__s);
    }
    node->string = __dest;
  }
  return;
}

Assistant:

void NJDNode_add_string(NJDNode * node, const char *str)
{
   char *c;

   if (str != NULL) {
      if (node->string == NULL) {
         node->string = strdup(str);
      } else {
         c = (char *) calloc(strlen(node->string) + strlen(str) + 1, sizeof(char));
         strcpy(c, node->string);
         strcat(c, str);
         free(node->string);
         node->string = c;
      }
   }
}